

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O0

void __thiscall
Camera::Camera(Camera *this,Vec3 *origin,Vec3 *lookat,Vec3 *up,float fov,float aspect,float aperture
              ,float focus_distance,float time_open,float time_close)

{
  Vec3 *v1;
  Vec3 *v2;
  long in_RDI;
  float in_XMM0_Da;
  double dVar1;
  float in_XMM1_Da;
  float in_XMM2_Da;
  undefined4 in_XMM4_Da;
  undefined4 in_XMM5_Da;
  Vec3 _half_vertical;
  Vec3 _half_horizontal;
  float _half_width;
  float _half_height;
  float _theta;
  Vec3 *in_stack_fffffffffffffe98;
  Vec3 *in_stack_fffffffffffffea0;
  Vec3 *in_stack_fffffffffffffea8;
  Vec3 local_104;
  Vec3 local_f8;
  Vec3 local_ec;
  Vec3 local_e0;
  Vec3 local_d4;
  Vec3 local_c8;
  Vec3 local_bc;
  Vec3 local_b0;
  Vec3 local_a4;
  Vec3 local_98;
  Vec3 local_8c;
  Vec3 local_80;
  Vec3 local_74;
  Vec3 local_68;
  Vec3 local_5c;
  float local_50;
  float local_4c;
  float local_48;
  undefined4 local_38;
  undefined4 local_34;
  float local_2c;
  float local_28;
  float local_24;
  
  local_38 = in_XMM5_Da;
  local_34 = in_XMM4_Da;
  local_2c = in_XMM2_Da;
  local_28 = in_XMM1_Da;
  local_24 = in_XMM0_Da;
  Vec3::Vec3(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  Vec3::Vec3((Vec3 *)(in_RDI + 0xc));
  Vec3::Vec3((Vec3 *)(in_RDI + 0x18));
  Vec3::Vec3((Vec3 *)(in_RDI + 0x24));
  Vec3::Vec3((Vec3 *)(in_RDI + 0x30));
  Vec3::Vec3((Vec3 *)(in_RDI + 0x3c));
  Vec3::Vec3((Vec3 *)(in_RDI + 0x48));
  *(float *)(in_RDI + 0x54) = local_2c * 0.5;
  *(undefined4 *)(in_RDI + 0x58) = local_34;
  *(undefined4 *)(in_RDI + 0x5c) = local_38;
  local_48 = degrees_to_radians(local_24);
  dVar1 = std::tan((double)(ulong)(uint)(local_48 * 0.5));
  local_4c = SUB84(dVar1,0);
  local_50 = local_28 * local_4c;
  operator-(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  unit_vector(in_stack_fffffffffffffea8);
  v1 = (Vec3 *)(in_RDI + 0x48);
  *(float *)(in_RDI + 0x50) = local_5c.e[2];
  *(undefined8 *)(in_RDI + 0x48) = local_5c.e._0_8_;
  Vec3::~Vec3(&local_5c);
  Vec3::~Vec3(&local_68);
  cross(v1,in_stack_fffffffffffffea0);
  unit_vector(v1);
  v2 = (Vec3 *)(in_RDI + 0x30);
  *(float *)(in_RDI + 0x38) = local_74.e[2];
  *(undefined8 *)(in_RDI + 0x30) = local_74.e._0_8_;
  Vec3::~Vec3(&local_74);
  Vec3::~Vec3(&local_80);
  cross(v1,v2);
  *(float *)(in_RDI + 0x44) = local_8c.e[2];
  *(undefined8 *)(in_RDI + 0x3c) = local_8c.e._0_8_;
  Vec3::~Vec3(&local_8c);
  operator*((float)((ulong)v1 >> 0x20),v2);
  operator*(v1,(float)((ulong)v2 >> 0x20));
  Vec3::~Vec3(&local_a4);
  operator*((float)((ulong)v1 >> 0x20),v2);
  operator*(v1,(float)((ulong)v2 >> 0x20));
  Vec3::~Vec3(&local_bc);
  operator*((float)((ulong)v1 >> 0x20),v2);
  *(float *)(in_RDI + 0x20) = local_c8.e[2];
  *(undefined8 *)(in_RDI + 0x18) = local_c8.e._0_8_;
  Vec3::~Vec3(&local_c8);
  operator*((float)((ulong)v1 >> 0x20),v2);
  *(float *)(in_RDI + 0x2c) = local_d4.e[2];
  *(undefined8 *)(in_RDI + 0x24) = local_d4.e._0_8_;
  Vec3::~Vec3(&local_d4);
  operator-(v1,v2);
  operator-(v1,v2);
  operator*(v1,(float)((ulong)v2 >> 0x20));
  operator-(v1,v2);
  *(undefined8 *)(in_RDI + 0xc) = local_e0.e._0_8_;
  *(float *)(in_RDI + 0x14) = local_e0.e[2];
  Vec3::~Vec3(&local_e0);
  Vec3::~Vec3(&local_104);
  Vec3::~Vec3(&local_ec);
  Vec3::~Vec3(&local_f8);
  Vec3::~Vec3(&local_b0);
  Vec3::~Vec3(&local_98);
  return;
}

Assistant:

Camera::Camera(const Vec3& origin, const Vec3& lookat, const Vec3& up, float fov, float aspect, float aperture, float focus_distance, float time_open, float time_close)
: m_origin(origin), m_lens_radius(aperture * 0.5f), m_time_open(time_open), m_time_close(time_close)
{ 
    float _theta       = degrees_to_radians(fov);
    float _half_height = tan(_theta/2.0f);
    float _half_width  = aspect * _half_height;
    
    m_w = unit_vector(origin - lookat);
    m_u = unit_vector(cross(up, m_w));
    m_v = cross(m_w, m_u);
    
    Vec3 _half_horizontal = _half_width  * m_u * focus_distance;
    Vec3 _half_vertical   = _half_height * m_v * focus_distance;

    m_horizontal        = 2.0f * _half_horizontal;
    m_vertical          = 2.0f * _half_vertical;
    m_lower_left_corner = m_origin - _half_horizontal - _half_vertical - m_w * focus_distance;
}